

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lookup.c
# Opt level: O2

int main(int argc,char **argv)

{
  rnnvalue *prVar1;
  bool bVar2;
  int iVar3;
  rnndb *db;
  rnndeccontext *ctx;
  ulonglong addr;
  ulonglong value;
  rnnenum *prVar4;
  rnndomain *domain;
  rnndecaddrinfo *prVar5;
  char *pcVar6;
  rnnbitset *prVar7;
  long lVar8;
  ulong uVar9;
  ulong uVar10;
  char *pcVar11;
  char local_59;
  char *local_58;
  char *variant;
  char *local_38;
  
  variant = (char *)0x0;
  rnn_init();
  if (argc < 2) {
switchD_001023f1_default:
    usage();
    xmlCheckVersion(0x51b1);
    iVar3 = xmlInitParser();
    return iVar3;
  }
  bVar2 = false;
  db = rnn_newdb();
  local_38 = "nv_mmio.xml";
  local_58 = "NV_MMIO";
  local_59 = 'd';
  while( true ) {
    iVar3 = getopt(argc,argv,"f:a:d:e:b:c");
    pcVar11 = _optarg;
    if (iVar3 << 0x18 == -0x1000000) break;
    switch((iVar3 << 0x18) >> 0x18) {
    case 0x61:
      iVar3 = strncasecmp(_optarg,"NV",2);
      if (iVar3 == 0) {
        variant = strdup(pcVar11);
      }
      else {
        asprintf(&variant,"NV%s",pcVar11);
      }
      break;
    case 0x62:
      local_58 = strdup(_optarg);
      local_59 = 'b';
      break;
    case 99:
      bVar2 = true;
      break;
    case 100:
      local_58 = strdup(_optarg);
      local_59 = 'd';
      break;
    case 0x65:
      local_58 = strdup(_optarg);
      local_59 = 'e';
      break;
    case 0x66:
      local_38 = strdup(_optarg);
      break;
    default:
      goto switchD_001023f1_default;
    }
  }
  rnn_parsefile(db,local_38);
  rnn_prepdb(db);
  ctx = rnndec_newcontext(db);
  if (!bVar2) {
    ctx->colors = &rnndec_colorsterm;
  }
  if (variant != (char *)0x0) {
    rnndec_varadd(ctx,"chipset",variant);
  }
  while( true ) {
    lVar8 = (long)_optind;
    pcVar11 = argv[lVar8];
    if (((*pcVar11 != '-') || (pcVar11[1] != 'v')) || (pcVar11[2] != '\0')) break;
    rnndec_varadd(ctx,argv[lVar8 + 1],argv[lVar8 + 2]);
    _optind = _optind + 3;
  }
  if (argc <= _optind) {
    fwrite("No address specified.\n",0x16,1,_stderr);
    return 1;
  }
  value = 0;
  addr = strtoull(pcVar11,(char **)0x0,0x10);
  if (_optind + 1 < argc) {
    value = strtoull(argv[(long)_optind + 1],(char **)0x0,0x10);
  }
  if (local_59 == 'b') {
    prVar7 = rnn_findbitset(db,local_58);
    if (prVar7 != (rnnbitset *)0x0) {
      pcVar11 = "TODO";
      goto LAB_0010268b;
    }
    pcVar11 = "Not a bitset: \'%s\'\n";
  }
  else if (local_59 == 'd') {
    domain = rnn_finddomain(db,local_58);
    if (domain != (rnndomain *)0x0) {
      prVar5 = rnndec_decodeaddr(ctx,domain,addr,0);
      if (prVar5 == (rnndecaddrinfo *)0x0) {
        return 1;
      }
      pcVar11 = prVar5->name;
      if (prVar5->typeinfo != (rnntypeinfo *)0x0) {
        pcVar6 = rnndec_decodeval(ctx,prVar5->typeinfo,value,prVar5->width);
        printf("%s => %s\n",pcVar11,pcVar6);
        return 0;
      }
      goto LAB_0010268b;
    }
    pcVar11 = "Not a domain: \'%s\'\n";
  }
  else {
    if (local_59 != 'e') {
      return 1;
    }
    prVar4 = rnn_findenum(db,local_58);
    if (prVar4 != (rnnenum *)0x0) {
      uVar10 = 0;
      uVar9 = (ulong)(uint)prVar4->valsnum;
      if (prVar4->valsnum < 1) {
        uVar9 = uVar10;
      }
      while( true ) {
        if (uVar9 == uVar10) {
          printf("%#lx\n",addr);
          return 0;
        }
        prVar1 = prVar4->vals[uVar10];
        if ((prVar1->valvalid != 0) && (prVar1->value == addr)) break;
        uVar10 = uVar10 + 1;
      }
      pcVar11 = prVar1->name;
LAB_0010268b:
      puts(pcVar11);
      return 0;
    }
    pcVar11 = "Not an enum: \'%s\'\n";
  }
  fprintf(_stderr,pcVar11,local_58);
  return 1;
}

Assistant:

int main(int argc, char **argv) {
	char *file = "nv_mmio.xml";
	char *name = "NV_MMIO";
	char *variant = NULL;
	char c, mode = 'd';
	uint64_t reg, colors=1, val = 0;
	struct rnndeccontext *vc;

	rnn_init();
	if (argc < 2) {
		usage();
	}
	struct rnndb *db = rnn_newdb();

	/* Arguments parsing */
	while ((c = getopt (argc, argv, "f:a:d:e:b:c")) != -1) {
		switch (c) {
			case 'f':
				file = strdup(optarg);
				break;
			case 'e':
				mode = 'e';
				name = strdup(optarg);
				break;
			case 'b':
				mode = 'b';
				name = strdup(optarg);
				break;
			case 'd':
				mode = 'd';
				name = strdup(optarg);
				break;
			case 'a':
				if (!strncasecmp(optarg, "NV", 2))
					variant = strdup(optarg);
				else
					asprintf(&variant, "NV%s", optarg);
				break;
			case 'c':
				colors = 0;
				break;
			default: usage();
		}
	}

	rnn_parsefile (db, file);
	rnn_prepdb (db);
	vc = rnndec_newcontext(db);
	if(colors)
		vc->colors = &rnndec_colorsterm;

	if (variant)
		rnndec_varadd(vc, "chipset", variant);

	/* Parse extra arguments */
	while (!strcmp (argv[optind], "-v")) {
		rnndec_varadd(vc, argv[optind+1], argv[optind+2]);
		optind+=3;
	}

	if (optind >= argc) {
		fprintf (stderr, "No address specified.\n");
		return 1;
	}

	reg = strtoull(argv[optind], 0, 16);
	if (optind + 1 < argc)
		val = strtoull(argv[optind + 1], 0, 16);

	if (mode == 'e') {
		struct rnnenum *en = rnn_findenum (db, name);
		if (en) {
			int i;
			int dec = 0;
			for (i = 0; i < en->valsnum; i++)
				if (en->vals[i]->valvalid && en->vals[i]->value == reg) {
					printf ("%s\n", en->vals[i]->name);
					dec = 1;
					break;
				}
			if (!dec)
				printf ("%#"PRIx64"\n", reg);

			return 0;
		} else {
			fprintf(stderr, "Not an enum: '%s'\n", name);
			return 1;
		}
	} else if (mode == 'b') {
		struct rnnbitset *bs = rnn_findbitset (db, name);

		if (bs) {
			printf("TODO\n");
			return 0;
		} else {
			fprintf(stderr, "Not a bitset: '%s'\n", name);
			return 1;
		}

	} else if (mode == 'd') {
		struct rnndomain *dom = rnn_finddomain (db, name);

		if (dom) {
			struct rnndecaddrinfo *info = rnndec_decodeaddr(vc, dom, reg, 0);
			if (info && info->typeinfo)
				printf ("%s => %s\n", info->name, rnndec_decodeval(vc, info->typeinfo, val, info->width));
			else if (info)
				printf ("%s\n", info->name);
			else
				return 1;
			return 0;
		} else {
			fprintf(stderr, "Not a domain: '%s'\n", name);
			return 1;
		}
	} else {
		return 1;
	}
}